

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestCollectorUntil0::run(void)

{
  CollectorResult CVar1;
  socklen_t sVar2;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  byte local_eb;
  byte local_e9;
  bool result;
  function<bool_()> local_c8;
  code *local_a8;
  undefined8 local_a0;
  function<bool_()> local_98;
  code *local_78;
  undefined8 local_70;
  function<bool_()> local_68;
  function<bool_()> local_38;
  ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_> local_18;
  Signal<bool_(),_Simple::CollectorUntil0<bool>_> sig_until0;
  TestCollectorUntil0 self;
  
  TestCollectorUntil0((TestCollectorUntil0 *)
                      ((long)&sig_until0.super_ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>.
                              callback_ring_ + 6));
  std::function<bool_()>::function(&local_38);
  Simple::Signal<bool_(),_Simple::CollectorUntil0<bool>_>::Signal
            ((Signal<bool_(),_Simple::CollectorUntil0<bool>_> *)&local_18,&local_38);
  std::function<bool_()>::~function(&local_38);
  local_78 = handler_true;
  local_70 = 0;
  sVar2 = 0;
  Simple::slot<TestCollectorUntil0,TestCollectorUntil0,bool>
            (&local_68,
             (Simple *)
             ((long)&sig_until0.super_ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>.
                     callback_ring_ + 6),(TestCollectorUntil0 *)handler_true,0);
  Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>::connect
            (&local_18,(int)&local_68,__addr,sVar2);
  std::function<bool_()>::~function(&local_68);
  local_a8 = handler_false;
  local_a0 = 0;
  sVar2 = 0;
  Simple::slot<TestCollectorUntil0,TestCollectorUntil0,bool>
            (&local_98,
             (Simple *)
             ((long)&sig_until0.super_ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>.
                     callback_ring_ + 6),(TestCollectorUntil0 *)handler_false,0);
  Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>::connect
            (&local_18,(int)&local_98,__addr_00,sVar2);
  std::function<bool_()>::~function(&local_98);
  sVar2 = 0;
  Simple::slot<TestCollectorUntil0,TestCollectorUntil0,bool>
            (&local_c8,
             (Simple *)
             ((long)&sig_until0.super_ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>.
                     callback_ring_ + 6),(TestCollectorUntil0 *)handler_abort,0);
  Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>::connect
            (&local_18,(int)&local_c8,__addr_01,sVar2);
  std::function<bool_()>::~function(&local_c8);
  local_e9 = 0;
  if ((sig_until0.super_ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>.callback_ring_._6_1_ &
      1) == 0) {
    local_e9 = sig_until0.super_ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>.callback_ring_.
               _7_1_ ^ 0xff;
  }
  if ((local_e9 & 1) == 0) {
    __assert_fail("!self.check1 && !self.check2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0x96,"static void TestCollectorUntil0::run()");
  }
  CVar1 = Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>::emit(&local_18);
  local_eb = 0;
  if ((!CVar1) &&
     (local_eb = 0,
     (sig_until0.super_ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>.callback_ring_._6_1_ & 1
     ) != 0)) {
    local_eb = sig_until0.super_ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>.callback_ring_.
               _7_1_;
  }
  if ((local_eb & 1) == 0) {
    __assert_fail("!result && self.check1 && self.check2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0x98,"static void TestCollectorUntil0::run()");
  }
  Simple::Signal<bool_(),_Simple::CollectorUntil0<bool>_>::~Signal
            ((Signal<bool_(),_Simple::CollectorUntil0<bool>_> *)&local_18);
  return;
}

Assistant:

static void
  run ()
  {
    TestCollectorUntil0 self;
    Simple::Signal<bool (), Simple::CollectorUntil0<bool>> sig_until0;
    sig_until0.connect(Simple::slot (self, &TestCollectorUntil0::handler_true));
    sig_until0.connect(Simple::slot (self, &TestCollectorUntil0::handler_false));
    sig_until0.connect(Simple::slot (self, &TestCollectorUntil0::handler_abort));
    assert (!self.check1 && !self.check2);
    const bool result = sig_until0.emit();
    assert (!result && self.check1 && self.check2);
  }